

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# akarin_timer.cpp
# Opt level: O2

float AkarinTimer::get_delta_time(void)

{
  int iVar1;
  duration dVar2;
  long lVar3;
  
  if (get_delta_time()::start_time == '\0') {
    iVar1 = __cxa_guard_acquire(&get_delta_time()::start_time);
    if (iVar1 != 0) {
      get_delta_time::start_time.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      __cxa_guard_release(&get_delta_time()::start_time);
    }
  }
  dVar2.__r = std::chrono::_V2::system_clock::now();
  lVar3 = dVar2.__r - (long)get_delta_time::start_time.__d.__r;
  get_delta_time::start_time.__d.__r = (duration)(duration)dVar2.__r;
  return (float)lVar3 / 1e+09;
}

Assistant:

float AkarinTimer::get_delta_time() noexcept
{
    static auto start_time = std::chrono::high_resolution_clock::now();
    auto end = std::chrono::high_resolution_clock::now();
    std::chrono::duration<float> elapsed_seconds = end - start_time;
    start_time = end;
    return elapsed_seconds.count();
}